

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyOctalStrToInt64(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  ushort *in_RAX;
  ushort **ppuVar4;
  byte *pbVar5;
  long lVar6;
  ushort *puVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  bool bVar11;
  
  pbVar10 = (byte *)(zSrc + nLen);
LAB_00119b45:
  if (pbVar10 <= zSrc) {
LAB_00119b7b:
    bVar11 = false;
    goto LAB_00119b88;
  }
  ppuVar4 = __ctype_b_loc();
  bVar2 = *zSrc;
  in_RAX = (ushort *)(long)(char)bVar2;
  if ((*(byte *)((long)*ppuVar4 + (long)in_RAX * 2 + 1) & 0x20) != 0) {
    zSrc = (char *)((byte *)zSrc + 1);
    goto LAB_00119b45;
  }
  in_RAX = (ushort *)(ulong)bVar2;
  if ((bVar2 != 0x2b) && (bVar2 != 0x2d)) goto LAB_00119b7b;
  bVar11 = bVar2 == 0x2d;
  in_RAX = (ushort *)(ulong)bVar11;
  do {
    zSrc = (char *)((byte *)zSrc + 1);
LAB_00119b88:
  } while ((zSrc < pbVar10) && (*zSrc == 0x30));
  puVar7 = (ushort *)0x0;
  pbVar5 = (byte *)zSrc;
  for (lVar6 = 0; pbVar9 = (byte *)zSrc + lVar6, pbVar9 < pbVar10; lVar6 = lVar6 + 4) {
    ppuVar4 = __ctype_b_loc();
    in_RAX = *ppuVar4;
    bVar2 = *pbVar9;
    pbVar9 = pbVar5;
    if (((*(byte *)((long)in_RAX + (long)(char)bVar2 * 2 + 1) & 8) == 0) || ('7' < (char)bVar2))
    break;
    puVar7 = (ushort *)(((long)(char)bVar2 + (long)puVar7 * 8) - 0x30);
    pbVar1 = pbVar5 + 1;
    pbVar8 = (byte *)zSrc + lVar6 + 1;
    pbVar9 = pbVar1;
    if (pbVar10 <= pbVar8) break;
    bVar2 = *pbVar8;
    pbVar9 = pbVar8;
    if ((((*(byte *)((long)in_RAX + (long)(char)bVar2 * 2 + 1) & 8) == 0) ||
        (iVar3 = (int)lVar6, pbVar9 = pbVar1, 0x14 < iVar3 + 1)) || ('7' < (char)bVar2)) break;
    puVar7 = (ushort *)(((long)(char)bVar2 + (long)puVar7 * 8) - 0x30);
    pbVar9 = (byte *)zSrc + lVar6 + 2;
    if (pbVar10 <= pbVar9) break;
    pbVar1 = pbVar5 + 2;
    bVar2 = *pbVar9;
    pbVar9 = pbVar1;
    if ((((*(byte *)((long)in_RAX + (long)(char)bVar2 * 2 + 1) & 8) == 0) || (0x14 < iVar3 + 2)) ||
       ('7' < (char)bVar2)) break;
    puVar7 = (ushort *)(((long)(char)bVar2 + (long)puVar7 * 8) - 0x30);
    pbVar1 = pbVar5 + 3;
    pbVar8 = (byte *)zSrc + lVar6 + 3;
    pbVar9 = pbVar1;
    if (pbVar10 <= pbVar8) break;
    bVar2 = *pbVar8;
    pbVar9 = pbVar8;
    if ((((*(byte *)((long)in_RAX + (long)(char)bVar2 * 2 + 1) & 8) == 0) ||
        (in_RAX = (ushort *)(ulong)(iVar3 + 3U), pbVar9 = pbVar1, 0x14 < (int)(iVar3 + 3U))) ||
       ('7' < (char)bVar2)) break;
    puVar7 = (ushort *)(((long)(char)bVar2 + (long)puVar7 * 8) - 0x30);
    pbVar5 = pbVar5 + 4;
  }
  do {
    if (pbVar10 <= pbVar9) break;
    ppuVar4 = __ctype_b_loc();
    in_RAX = *ppuVar4;
    bVar2 = *pbVar9;
    pbVar9 = pbVar9 + 1;
  } while ((*(byte *)((long)in_RAX + (long)(char)bVar2 * 2 + 1) & 0x20) != 0);
  if (pOutVal != (void *)0x0) {
    in_RAX = (ushort *)-(long)puVar7;
    if (puVar7 == (ushort *)0x0) {
      in_RAX = puVar7;
    }
    if (!bVar11) {
      in_RAX = puVar7;
    }
    *(ushort **)pOutVal = in_RAX;
  }
  return (sxi32)in_RAX;
}

Assistant:

JX9_PRIVATE sxi32 SyOctalStrToInt64(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	const char *zIn, *zEnd;
	int isNeg = FALSE;
	sxi64 nVal = 0;
	int c;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while(zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++; 
	}
	zIn = zSrc;
	for(;;){
		if(zSrc >= zEnd || !SyisDigit(zSrc[0])){ break; } if( (c=zSrc[0]-'0') > 7 || (int)(zSrc-zIn) > 20){ break;} nVal = nVal * 8 +  c; zSrc++;
		if(zSrc >= zEnd || !SyisDigit(zSrc[0])){ break; } if( (c=zSrc[0]-'0') > 7 || (int)(zSrc-zIn) > 20){ break;} nVal = nVal * 8 +  c; zSrc++;
		if(zSrc >= zEnd || !SyisDigit(zSrc[0])){ break; } if( (c=zSrc[0]-'0') > 7 || (int)(zSrc-zIn) > 20){ break;} nVal = nVal * 8 +  c; zSrc++;
		if(zSrc >= zEnd || !SyisDigit(zSrc[0])){ break; } if( (c=zSrc[0]-'0') > 7 || (int)(zSrc-zIn) > 20){ break;} nVal = nVal * 8 +  c; zSrc++;
	}
	/* Skip trailing spaces */
	while(zSrc < zEnd && SyisSpace(zSrc[0])){
		zSrc++;
	}
	if( zRest ){
		*zRest = zSrc;
	}	
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi64 *)pOutVal = nVal;
	}
	return (zSrc >= zEnd) ? SXRET_OK : SXERR_SYNTAX;
}